

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  http_settings_s arg_settings;
  code *local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined2 uStack_18;
  undefined1 uStack_16;
  undefined5 uStack_15;
  undefined4 local_c;
  
  local_c = 0;
  llog_info("LotteHTTP is starting up...");
  HTTP_HEADER_SERVER = fiobj_str_new("server",6);
  HTTP_HEADER_SERVER_VALUE = fiobj_str_new("LotteHTTP/0.9.0",0xf);
  memset(&local_90,0,0x80);
  local_90 = on_request;
  uStack_16 = 1;
  arg_settings.log = 1;
  arg_settings.timeout = (undefined1)uStack_18;
  arg_settings.ws_timeout = uStack_18._1_1_;
  arg_settings._123_5_ = uStack_15;
  arg_settings.on_upgrade = (_func_void_http_s_ptr_char_ptr_size_t *)uStack_88;
  arg_settings.on_request = on_request;
  arg_settings.on_response = (_func_void_http_s_ptr *)local_80;
  arg_settings.on_finish = (_func_void_http_settings_s_ptr *)uStack_78;
  arg_settings.udata = (void *)local_70;
  arg_settings.public_folder = (char *)uStack_68;
  arg_settings.public_folder_length = local_60;
  arg_settings.max_header_size = uStack_58;
  arg_settings.max_body_size = local_50;
  arg_settings.max_clients = uStack_48;
  arg_settings.tls = (void *)local_40;
  arg_settings.reserved1 = uStack_38;
  arg_settings.reserved2 = local_30;
  arg_settings.reserved3 = uStack_28;
  arg_settings.ws_max_msg_size = local_20;
  http_listen("3000",(char *)0x0,arg_settings);
  fio_start((fio_start_args)0x1);
  return 0;
}

Assistant:

int main(void) {
    llog_info("LotteHTTP is starting up...");

    HTTP_HEADER_SERVER = fiobj_str_new("server", strsizeof("server"));
    HTTP_HEADER_SERVER_VALUE = fiobj_str_new("LotteHTTP/0.9.0", strsizeof("LotteHTTP/0.9.0"));

    http_listen("3000", NULL, .on_request = on_request, .log = 1);
    fio_start(.threads = 1);

    return 0;
}